

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ContinuousAssignSyntax * __thiscall
slang::parsing::Parser::parseContinuousAssign(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  SyntaxNode *this_00;
  undefined4 extraout_var;
  ContinuousAssignSyntax *pCVar3;
  Info *src;
  Info *extraout_RDX;
  Token TVar4;
  SourceRange range;
  Token TVar5;
  Token assign;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_198;
  uint local_188;
  size_type local_180;
  pointer local_178;
  size_type local_170;
  TimingControlSyntax *local_168;
  DriveStrengthSyntax *local_160;
  Info *local_158;
  undefined8 local_150;
  pointer local_148;
  size_type local_140;
  Token local_138;
  SyntaxKind local_128;
  pointer local_118;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  
  local_140 = attributes.size_;
  local_148 = attributes.data_;
  TVar4 = ParserBase::consume(&this->super_ParserBase);
  local_158 = TVar4.info;
  local_150 = TVar4._0_8_;
  local_160 = parseDriveStrength(this);
  local_168 = parseDelay3(this);
  Token::Token(&semi);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  TVar4 = ParserBase::peek(&this->super_ParserBase);
  local_138 = TVar4;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar4.kind);
  if (bVar1) {
    location = Token::location(&local_138);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,location);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar4.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar4,Semicolon,&semi,(DiagCode)0x260005);
      src = extraout_RDX;
      goto LAB_002b6019;
    }
    do {
      TVar4 = ParserBase::peek(&this->super_ParserBase);
      this_00 = &parseExpression(this)->super_SyntaxNode;
      if (this_00->kind != AssignmentExpression) {
        range = slang::syntax::SyntaxNode::sourceRange(this_00);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,range);
      }
      local_198._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)this_00;
      local_188 = CONCAT31(local_188._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_198._M_first);
      TVar5 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar5.kind);
      if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
      local_198._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_188 = local_188 & 0xffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_198._M_first);
      TVar5 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar5.kind);
      if (bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar5 = ParserBase::peek(&this->super_ParserBase);
    } while ((TVar4.info != TVar5.info || TVar4.kind != TVar5.kind) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x260005,true), bVar1));
  }
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = semi.info;
LAB_002b6019:
  local_188 = 1;
  local_180 = local_140;
  local_178 = local_148;
  local_170 = local_140;
  local_198 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4703a8);
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar2);
  local_128 = SeparatedList;
  local_138 = (Token)ZEXT816(0x4730a0);
  assign.info = local_158;
  assign.kind = (undefined2)local_150;
  assign._2_1_ = local_150._2_1_;
  assign.numFlags.raw = local_150._3_1_;
  assign.rawLen = local_150._4_4_;
  pCVar3 = slang::syntax::SyntaxFactory::continuousAssign
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_198._M_first,
                      assign,local_160,local_168,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_138,semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  return pCVar3;
}

Assistant:

ContinuousAssignSyntax& Parser::parseContinuousAssign(AttrList attributes) {
    auto assign = consume();
    auto strength = parseDriveStrength();
    auto delay = parseDelay3();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(
        buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
        diag::ExpectedContinuousAssignment, [this] {
            auto& expr = parseExpression();
            if (expr.kind != SyntaxKind::AssignmentExpression)
                addDiag(diag::ExpectedContinuousAssignment, expr.sourceRange());
            return &expr;
        });

    return factory.continuousAssign(attributes, assign, strength, delay, buffer.copy(alloc), semi);
}